

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O2

bool btPolyhedralContactClipping::findSeparatingAxis
               (btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,btTransform *transA,
               btTransform *transB,btVector3 *sep,Result *resultOut)

{
  btScalar *pbVar1;
  uint uVar2;
  btFace *pbVar3;
  ulong uVar4;
  float fVar5;
  bool bVar6;
  ulong uVar7;
  btVector3 *pbVar8;
  long lVar9;
  int e1;
  ulong uVar10;
  long lVar11;
  btScalar __x;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar13;
  float fVar14;
  float fVar15;
  btVector3 bVar16;
  btVector3 bVar17;
  btVector3 DeltaC2;
  btVector3 worldEdgeB;
  btScalar local_158;
  btVector3 wA;
  btVector3 worldEdgeA;
  float local_120;
  int local_11c;
  int local_118;
  btScalar dist;
  btVector3 *local_110;
  btVector3 dirA;
  btScalar d;
  float afStack_f0 [2];
  btTransform *local_e8;
  uint local_dc;
  undefined1 local_d8 [24];
  long local_c0;
  btVector3 wB;
  btVector3 wA_2;
  float local_88 [6];
  btVector3 wB_2;
  btVector3 WorldEdge1;
  btScalar tB;
  float local_48 [6];
  
  gActualSATPairTests = gActualSATPairTests + 1;
  local_110 = sep;
  bVar16 = btTransform::operator()(transA,&hullA->m_localCenter);
  local_d8._8_4_ = extraout_XMM0_Dc;
  local_d8._0_8_ = bVar16.m_floats._0_8_;
  local_d8._12_4_ = extraout_XMM0_Dd;
  bVar17 = btTransform::operator()(transB,&hullB->m_localCenter);
  local_158 = bVar16.m_floats[2];
  DeltaC2.m_floats[1] = (float)local_d8._4_4_ - bVar17.m_floats[1];
  DeltaC2.m_floats[0] = (float)local_d8._0_4_ - bVar17.m_floats[0];
  DeltaC2.m_floats[2] = local_158 - bVar17.m_floats[2];
  DeltaC2.m_floats[3] = 0.0;
  uVar2 = (hullA->m_faces).m_size;
  uVar10 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar10;
  }
  local_158 = 3.4028235e+38;
  for (; uVar7 * 0x30 - uVar10 != 0; uVar10 = uVar10 + 0x30) {
    pbVar3 = (hullA->m_faces).m_data;
    worldEdgeA.m_floats[1] = *(btScalar *)((long)pbVar3->m_plane + uVar10 + 4);
    worldEdgeA.m_floats[0] = *(btScalar *)((long)pbVar3->m_plane + uVar10);
    worldEdgeA.m_floats[3] = 0.0;
    worldEdgeA.m_floats[2] = (btScalar)*(uint *)((long)pbVar3->m_plane + uVar10 + 8);
    worldEdgeB = operator*(&transA->m_basis,&worldEdgeA);
    if (DeltaC2.m_floats[2] * worldEdgeB.m_floats[2] +
        DeltaC2.m_floats[0] * worldEdgeB.m_floats[0] + worldEdgeB.m_floats[1] * DeltaC2.m_floats[1]
        < 0.0) {
      uVar4 = worldEdgeB.m_floats._0_8_ ^ 0x8000000080000000;
      worldEdgeB.m_floats[2] = -worldEdgeB.m_floats[2];
      worldEdgeB.m_floats[0] = (btScalar)(int)uVar4;
      worldEdgeB.m_floats[1] = (btScalar)(int)(uVar4 >> 0x20);
    }
    gExpectedNbTests = gExpectedNbTests + 1;
    if (gUseInternalObject == true) {
      bVar6 = TestInternalObjects(transA,transB,&DeltaC2,&worldEdgeB,hullA,hullB,local_158);
      if (bVar6) goto LAB_00168b3b;
    }
    else {
LAB_00168b3b:
      gActualNbTests = gActualNbTests + 1;
      bVar6 = TestSepAxis(hullA,hullB,transA,transB,&worldEdgeB,&d,&wA,&wB);
      if (!bVar6) goto LAB_00168ce8;
      if (d < local_158) {
        *(undefined8 *)local_110->m_floats = worldEdgeB.m_floats._0_8_;
        *(undefined8 *)(local_110->m_floats + 2) = worldEdgeB.m_floats._8_8_;
        local_158 = d;
      }
    }
  }
  uVar2 = (hullB->m_faces).m_size;
  uVar10 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar10;
  }
  lVar11 = uVar7 * 0x30;
  for (; lVar11 - uVar10 != 0; uVar10 = uVar10 + 0x30) {
    pbVar3 = (hullB->m_faces).m_data;
    worldEdgeA.m_floats[1] = *(btScalar *)((long)pbVar3->m_plane + uVar10 + 4);
    worldEdgeA.m_floats[0] = *(btScalar *)((long)pbVar3->m_plane + uVar10);
    worldEdgeA.m_floats[3] = 0.0;
    worldEdgeA.m_floats[2] = (btScalar)*(uint *)((long)pbVar3->m_plane + uVar10 + 8);
    worldEdgeB = operator*(&transB->m_basis,&worldEdgeA);
    if (DeltaC2.m_floats[2] * worldEdgeB.m_floats[2] +
        DeltaC2.m_floats[0] * worldEdgeB.m_floats[0] + worldEdgeB.m_floats[1] * DeltaC2.m_floats[1]
        < 0.0) {
      uVar7 = worldEdgeB.m_floats._0_8_ ^ 0x8000000080000000;
      worldEdgeB.m_floats[2] = -worldEdgeB.m_floats[2];
      worldEdgeB.m_floats[0] = (btScalar)(int)uVar7;
      worldEdgeB.m_floats[1] = (btScalar)(int)(uVar7 >> 0x20);
    }
    gExpectedNbTests = gExpectedNbTests + 1;
    if (gUseInternalObject == true) {
      bVar6 = TestInternalObjects(transA,transB,&DeltaC2,&worldEdgeB,hullA,hullB,local_158);
      if (bVar6) goto LAB_00168c7f;
    }
    else {
LAB_00168c7f:
      gActualNbTests = gActualNbTests + 1;
      bVar6 = TestSepAxis(hullA,hullB,transA,transB,&worldEdgeB,&d,&wA,&wB);
      if (!bVar6) goto LAB_00168ce8;
      if (d < local_158) {
        *(undefined8 *)local_110->m_floats = worldEdgeB.m_floats._0_8_;
        *(undefined8 *)(local_110->m_floats + 2) = worldEdgeB.m_floats._8_8_;
        local_158 = d;
      }
    }
  }
  local_d8._0_8_ = hullA;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  lVar9 = 0;
  fVar5 = 0.0;
  local_120 = 0.0;
  local_11c = -1;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_118 = local_11c;
  local_e8 = transA;
  while( true ) {
    bVar16.m_floats = worldEdgeB.m_floats;
    uVar7 = CONCAT71((int7)((ulong)lVar11 >> 8),*(int *)(local_d8._0_8_ + 0x4c) <= lVar9);
    if (*(int *)(local_d8._0_8_ + 0x4c) <= lVar9) break;
    local_dc = (uint)uVar7;
    pbVar1 = (btScalar *)(*(long *)(local_d8._0_8_ + 0x58) + lVar9 * 0x10);
    wA.m_floats._0_8_ = *(undefined8 *)pbVar1;
    wA.m_floats._8_8_ = *(undefined8 *)(pbVar1 + 2);
    local_c0 = lVar9;
    wB = operator*(&local_e8->m_basis,&wA);
    lVar9 = 0;
    for (lVar11 = 0; lVar11 < (hullB->m_uniqueEdges).m_size; lVar11 = lVar11 + 1) {
      pbVar1 = (btScalar *)((long)((hullB->m_uniqueEdges).m_data)->m_floats + lVar9);
      _d = *(undefined8 *)pbVar1;
      afStack_f0 = *(float (*) [2])(pbVar1 + 2);
      WorldEdge1 = operator*(&transB->m_basis,(btVector3 *)&d);
      dirA = btVector3::cross(&wB,&WorldEdge1);
      bVar6 = IsAlmostZero(&dirA);
      bVar16 = wB_2;
      if (!bVar6) {
        pbVar8 = btVector3::normalize(&dirA);
        uVar7 = *(ulong *)pbVar8->m_floats;
        dirA.m_floats[2] = (btScalar)*(undefined8 *)(pbVar8->m_floats + 2);
        bVar16.m_floats = *&pbVar8->m_floats;
        if (DeltaC2.m_floats[2] * dirA.m_floats[2] +
            DeltaC2.m_floats[0] * (float)uVar7 + (float)(uVar7 >> 0x20) * DeltaC2.m_floats[1] < 0.0)
        {
          dirA.m_floats[3] = (btScalar)((ulong)*(undefined8 *)(pbVar8->m_floats + 2) >> 0x20);
          dirA.m_floats[2] = -dirA.m_floats[2];
          dirA.m_floats[0] = (btScalar)(int)(uVar7 ^ 0x8000000080000000);
          dirA.m_floats[1] = (btScalar)(int)((uVar7 ^ 0x8000000080000000) >> 0x20);
          bVar16.m_floats = dirA.m_floats;
        }
        dirA.m_floats = bVar16.m_floats;
        gExpectedNbTests = gExpectedNbTests + 1;
        if (gUseInternalObject == true) {
          bVar6 = TestInternalObjects(local_e8,transB,&DeltaC2,&dirA,
                                      (btConvexPolyhedron *)local_d8._0_8_,hullB,local_158);
          bVar16 = wB_2;
          if (!bVar6) goto LAB_00168f7c;
        }
        gActualNbTests = gActualNbTests + 1;
        bVar6 = TestSepAxis((btConvexPolyhedron *)local_d8._0_8_,hullB,local_e8,transB,&dirA,&dist,
                            &wA_2,&wB_2);
        bVar16 = wB_2;
        bVar17 = wB;
        if (!bVar6) {
          uVar7 = (ulong)local_dc;
          goto LAB_00168fa0;
        }
        wB = bVar17;
        if (dist < local_158) {
          *(undefined8 *)local_110->m_floats = dirA.m_floats._0_8_;
          *(undefined8 *)(local_110->m_floats + 2) = dirA.m_floats._8_8_;
          worldEdgeA.m_floats[0] = wB.m_floats[0];
          worldEdgeA.m_floats[1] = wB.m_floats[1];
          worldEdgeA.m_floats[2] = wB.m_floats[2];
          worldEdgeA.m_floats[3] = wB.m_floats[3];
          worldEdgeB = WorldEdge1;
          local_48[0] = wA_2.m_floats[0];
          local_48[1] = wA_2.m_floats[1];
          local_48[2] = 0.0;
          local_48[3] = 0.0;
          local_120 = wA_2.m_floats[2];
          local_88[0] = wB_2.m_floats[0];
          local_88[1] = wB_2.m_floats[1];
          wB_2.m_floats[2] = bVar16.m_floats[2];
          local_11c = (int)lVar11;
          local_118 = (int)local_c0;
          local_158 = dist;
          fVar5 = wB_2.m_floats[2];
        }
      }
LAB_00168f7c:
      wB_2.m_floats = bVar16.m_floats;
      lVar9 = lVar9 + 0x10;
    }
    lVar9 = local_c0 + 1;
  }
  if ((-1 < local_118) && (-1 < local_11c)) {
    WorldEdge1.m_floats[1] = local_88[1] - local_48[1];
    WorldEdge1.m_floats[0] = local_88[0] - local_48[0];
    WorldEdge1.m_floats[2] = fVar5 - local_120;
    WorldEdge1.m_floats[3] = 0.0;
    dirA.m_floats[2] = worldEdgeA.m_floats[2];
    dirA.m_floats[3] = worldEdgeA.m_floats[3];
    dirA.m_floats[0] = worldEdgeA.m_floats[0];
    dirA.m_floats[1] = worldEdgeA.m_floats[1];
    wA_2.m_floats[0] = worldEdgeB.m_floats[0];
    wA_2.m_floats[1] = worldEdgeB.m_floats[1];
    wA_2.m_floats[2] = worldEdgeB.m_floats[2];
    wA_2.m_floats[3] = worldEdgeB.m_floats[3];
    worldEdgeB.m_floats = bVar16.m_floats;
    btSegmentsClosestPoints(&wA,&wB,(btVector3 *)&d,&dist,&tB,&WorldEdge1,&dirA,1e+30,&wA_2,1e+30);
    __x = btVector3::length2(&wA);
    if (1.1920929e-07 < __x) {
      if (__x < 0.0) {
        fVar12 = sqrtf(__x);
      }
      else {
        fVar12 = SQRT(__x);
      }
      fVar13 = 1.0 / fVar12;
      fVar14 = fVar13 * wA.m_floats[0];
      fVar15 = fVar13 * wA.m_floats[1];
      wA.m_floats[1] = fVar15;
      wA.m_floats[0] = fVar14;
      fVar13 = fVar13 * wA.m_floats[2];
      if (DeltaC2.m_floats[2] * fVar13 + DeltaC2.m_floats[0] * fVar14 + fVar15 * DeltaC2.m_floats[1]
          < 0.0) {
        wA.m_floats._0_8_ = CONCAT44(fVar15,fVar14) ^ 0x8000000080000000;
        fVar13 = -fVar13;
      }
      wA.m_floats[2] = fVar13;
      wB_2.m_floats[1] = local_88[1] + SUB84(_d,4);
      wB_2.m_floats[0] = local_88[0] + (float)_d;
      wB_2.m_floats[2] = fVar5 + afStack_f0[0];
      wB_2.m_floats[3] = 0.0;
      (*resultOut->_vptr_Result[4])(-fVar12,resultOut,&wA);
    }
  }
  pbVar8 = local_110;
  if (DeltaC2.m_floats[2] * local_110->m_floats[2] +
      DeltaC2.m_floats[0] * local_110->m_floats[0] + DeltaC2.m_floats[1] * local_110->m_floats[1] <
      0.0) {
    bVar16 = operator-(local_110);
    *&pbVar8->m_floats = bVar16.m_floats;
  }
LAB_00168fa0:
  return (bool)(char)uVar7;
LAB_00168ce8:
  uVar7 = 0;
  goto LAB_00168fa0;
}

Assistant:

bool btPolyhedralContactClipping::findSeparatingAxis(	const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, btVector3& sep, btDiscreteCollisionDetectorInterface::Result& resultOut)
{
	gActualSATPairTests++;

//#ifdef TEST_INTERNAL_OBJECTS
	const btVector3 c0 = transA * hullA.m_localCenter;
	const btVector3 c1 = transB * hullB.m_localCenter;
	const btVector3 DeltaC2 = c0 - c1;
//#endif

	btScalar dmin = FLT_MAX;
	int curPlaneTests=0;

	int numFacesA = hullA.m_faces.size();
	// Test normals from hullA
	for(int i=0;i<numFacesA;i++)
	{
		const btVector3 Normal(hullA.m_faces[i].m_plane[0], hullA.m_faces[i].m_plane[1], hullA.m_faces[i].m_plane[2]);
		btVector3 faceANormalWS = transA.getBasis() * Normal;
		if (DeltaC2.dot(faceANormalWS)<0)
			faceANormalWS*=-1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if(gUseInternalObject && !TestInternalObjects(transA,transB, DeltaC2, faceANormalWS, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		btScalar d;
		btVector3 wA,wB;
		if(!TestSepAxis( hullA, hullB, transA,transB, faceANormalWS, d,wA,wB))
			return false;

		if(d<dmin)
		{
			dmin = d;
			sep = faceANormalWS;
		}
	}

	int numFacesB = hullB.m_faces.size();
	// Test normals from hullB
	for(int i=0;i<numFacesB;i++)
	{
		const btVector3 Normal(hullB.m_faces[i].m_plane[0], hullB.m_faces[i].m_plane[1], hullB.m_faces[i].m_plane[2]);
		btVector3 WorldNormal = transB.getBasis() * Normal;
		if (DeltaC2.dot(WorldNormal)<0)
			WorldNormal *=-1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if(gUseInternalObject && !TestInternalObjects(transA,transB,DeltaC2, WorldNormal, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		btScalar d;
		btVector3 wA,wB;
		if(!TestSepAxis(hullA, hullB,transA,transB, WorldNormal,d,wA,wB))
			return false;

		if(d<dmin)
		{
			dmin = d;
			sep = WorldNormal;
		}
	}

	btVector3 edgeAstart,edgeAend,edgeBstart,edgeBend;
	int edgeA=-1;
	int edgeB=-1;
	btVector3 worldEdgeA;
	btVector3 worldEdgeB;
	btVector3 witnessPointA(0,0,0),witnessPointB(0,0,0);
	

	int curEdgeEdge = 0;
	// Test edges
	for(int e0=0;e0<hullA.m_uniqueEdges.size();e0++)
	{
		const btVector3 edge0 = hullA.m_uniqueEdges[e0];
		const btVector3 WorldEdge0 = transA.getBasis() * edge0;
		for(int e1=0;e1<hullB.m_uniqueEdges.size();e1++)
		{
			const btVector3 edge1 = hullB.m_uniqueEdges[e1];
			const btVector3 WorldEdge1 = transB.getBasis() * edge1;

			btVector3 Cross = WorldEdge0.cross(WorldEdge1);
			curEdgeEdge++;
			if(!IsAlmostZero(Cross))
			{
				Cross = Cross.normalize();
				if (DeltaC2.dot(Cross)<0)
					Cross *= -1.f;


#ifdef TEST_INTERNAL_OBJECTS
				gExpectedNbTests++;
				if(gUseInternalObject && !TestInternalObjects(transA,transB,DeltaC2, Cross, hullA, hullB, dmin))
					continue;
				gActualNbTests++;
#endif

				btScalar dist;
				btVector3 wA,wB;
				if(!TestSepAxis( hullA, hullB, transA,transB, Cross, dist,wA,wB))
					return false;

				if(dist<dmin)
				{
					dmin = dist;
					sep = Cross;
					edgeA=e0;
					edgeB=e1;
					worldEdgeA = WorldEdge0;
					worldEdgeB = WorldEdge1;
					witnessPointA=wA;
					witnessPointB=wB;
				}
			}
		}

	}

	if (edgeA>=0&&edgeB>=0)
	{
//		printf("edge-edge\n");
		//add an edge-edge contact

		btVector3 ptsVector;
		btVector3 offsetA;
		btVector3 offsetB;
		btScalar tA;
		btScalar tB;

		btVector3 translation = witnessPointB-witnessPointA;

		btVector3 dirA = worldEdgeA;
		btVector3 dirB = worldEdgeB;
		
		btScalar hlenB = 1e30f;
		btScalar hlenA = 1e30f;

		btSegmentsClosestPoints(ptsVector,offsetA,offsetB,tA,tB,
			translation,
			dirA, hlenA,
			dirB,hlenB);

		btScalar nlSqrt = ptsVector.length2();
		if (nlSqrt>SIMD_EPSILON)
		{
			btScalar nl = btSqrt(nlSqrt);
			ptsVector *= 1.f/nl;
			if (ptsVector.dot(DeltaC2)<0.f)
			{
				ptsVector*=-1.f;
			}
			btVector3 ptOnB = witnessPointB + offsetB;
			btScalar distance = nl;
			resultOut.addContactPoint(ptsVector, ptOnB,-distance);
		}

	}


	if((DeltaC2.dot(sep))<0.0f)
		sep = -sep;

	return true;
}